

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall BenevolentBotStrategy::fortifyArmyCount(BenevolentBotStrategy *this)

{
  int iVar1;
  int iVar2;
  int move;
  BenevolentBotStrategy *this_local;
  
  iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
  iVar2 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).to);
  this_local._4_4_ = (iVar1 - iVar2) / 2;
  if (this_local._4_4_ < 0) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int BenevolentBotStrategy::fortifyArmyCount() {
    int move = from->getNumberOfTroops();
    move = (move - to->getNumberOfTroops()) / 2;
    //bug fix : so that it doesnt try to move a negative number of armies
    if(move < 0){
        return 0;
    }
    return move;
}